

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O0

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char cVar1;
  size_t sVar2;
  char in_AL;
  bool bVar3;
  _Setw _Var4;
  ostream *__out;
  id __id;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1a28 [32];
  undefined8 local_1a08;
  undefined8 local_1a00;
  undefined8 local_19f8;
  undefined8 local_19e8;
  undefined8 local_19d8;
  undefined8 local_19c8;
  undefined8 local_19b8;
  undefined8 local_19a8;
  undefined8 local_1998;
  undefined8 local_1988;
  anon_class_32_4_235673e4 local_1970;
  undefined1 local_1949;
  undefined1 local_1948 [7];
  bool no_chop;
  va_list ap;
  size_t msg_size;
  char *msg_start;
  size_t size;
  char *buf;
  char buffer [3000];
  undefined1 local_d30 [8];
  ostream oss;
  StaticStringBuf<3000UL> sbuf;
  char *format_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  
  if (in_AL != '\0') {
    local_19f8 = in_XMM0_Qa;
    local_19e8 = in_XMM1_Qa;
    local_19d8 = in_XMM2_Qa;
    local_19c8 = in_XMM3_Qa;
    local_19b8 = in_XMM4_Qa;
    local_19a8 = in_XMM5_Qa;
    local_1998 = in_XMM6_Qa;
    local_1988 = in_XMM7_Qa;
  }
  local_1a08 = in_R8;
  local_1a00 = in_R9;
  if (((((fLB::FLAGS_logtostdout & 1) != 0) || ((fLB::FLAGS_logtostderr & 1) != 0)) ||
      (fLI::FLAGS_stderrthreshold <= (int)severity)) ||
     (((fLB::FLAGS_alsologtostderr & 1) != 0 || (bVar3 = IsGoogleLoggingInitialized(), !bVar3)))) {
    anon_unknown_6::StaticStringBuf<3000UL>::StaticStringBuf
              ((StaticStringBuf<3000UL> *)&oss.field_0x108);
    std::ostream::ostream(local_d30,(streambuf *)&oss.field_0x108);
    _Var4 = std::setw(5);
    __out = std::operator<<((ostream *)local_d30,_Var4);
    __id = std::this_thread::get_id();
    std::operator<<(__out,__id);
    size = (size_t)&buf;
    msg_start = (char *)0xbb8;
    cVar1 = **(char **)(LogSeverityNames + (ulong)severity * 8);
    pcVar5 = anon_unknown_6::StaticStringBuf<3000UL>::data
                       ((StaticStringBuf<3000UL> *)&oss.field_0x108);
    pcVar6 = glog_internal_namespace_::const_basename(file);
    DoRawLog((char **)&size,(size_t *)&msg_start,"%c00000000 00:00:00.000000 %s %s:%d] RAW: ",
             (ulong)(uint)(int)cVar1,pcVar5,pcVar6,line);
    sVar2 = size;
    pcVar5 = msg_start;
    ap[0].overflow_arg_area = local_1a28;
    ap[0]._0_8_ = &stack0x00000008;
    stack0xffffffffffffe6bc = 0x30;
    local_1948._0_4_ = 0x20;
    local_1949 = VADoRawLog((char **)&size,(size_t *)&msg_start,format,(__va_list_tag *)local_1948);
    if ((bool)local_1949) {
      DoRawLog((char **)&size,(size_t *)&msg_start,"\n");
    }
    else {
      DoRawLog((char **)&size,(size_t *)&msg_start,"RAW_LOG ERROR: The Message was too long!\n");
    }
    sVar7 = strlen((char *)&buf);
    syscall(1,2,&buf,sVar7);
    if (severity == FATAL) {
      local_1970.msg_start = (char *)sVar2;
      local_1970.msg_size = (size_t)pcVar5;
      local_1970.file = file;
      local_1970.line = line;
      std::call_once<google::RawLog__(google::LogSeverity,char_const*,int,char_const*,___)::__0>
                ((once_flag *)&crashed,&local_1970);
      LogMessage::Fail();
    }
    std::ostream::~ostream(local_d30);
    anon_unknown_6::StaticStringBuf<3000UL>::~StaticStringBuf
              ((StaticStringBuf<3000UL> *)&oss.field_0x108);
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostdout || FLAGS_logtostderr ||
        severity >= FLAGS_stderrthreshold || FLAGS_alsologtostderr ||
        !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }

  // We do not have any any option other that string streams to obtain the
  // thread identifier as the corresponding value is not convertible to an
  // integer. Use a statically allocated buffer to avoid dynamic memory
  // allocations.
  StaticStringBuf<kLogBufSize> sbuf;
  std::ostream oss(&sbuf);

  oss << std::setw(5) << std::this_thread::get_id();

  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  size_t size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c00000000 00:00:00.000000 %s %s:%d] RAW: ",
           LogSeverityNames[severity][0], sbuf.data(),
           const_basename(const_cast<char*>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const size_t msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL) {
    std::call_once(crashed, [file, line, msg_start, msg_size] {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    });
    LogMessage::Fail();  // abort()
  }
}